

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniTest.cpp
# Opt level: O2

void __thiscall TApp_IniQuotedOutput_Test::TestBody(TApp_IniQuotedOutput_Test *this)

{
  App *this_00;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *matcher;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *matcher_00;
  long lVar1;
  char *pcVar2;
  allocator local_219;
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_218;
  string local_1f8;
  AssertionResult gtest_ar_2;
  string str;
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  string val2;
  string val1;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  val1._M_dataplus._M_p = (pointer)&val1.field_2;
  val1._M_string_length = 0;
  val1.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_48,"--val1",(allocator *)&str);
  std::__cxx11::string::string((string *)&local_68,"",(allocator *)&val2);
  this_00 = &(this->super_TApp).app;
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (this_00,&local_48,&val1,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  val2._M_dataplus._M_p = (pointer)&val2.field_2;
  val2._M_string_length = 0;
  val2.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_88,"--val2",(allocator *)&str);
  pcVar2 = "";
  std::__cxx11::string::string((string *)&local_a8,"",(allocator *)&local_218);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (this_00,&local_88,&val2,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string((string *)&str,"--val1",(allocator *)&local_218);
  std::__cxx11::string::string(local_1a8,"I am a string",(allocator *)&local_1f8);
  std::__cxx11::string::string(local_188,"--val2",(allocator *)&gtest_ar_2);
  std::__cxx11::string::string(local_168,"I am a \"confusing\" string",&local_219);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(this->super_TApp).args,&str,&val2);
  lVar1 = 0x60;
  do {
    std::__cxx11::string::~string(local_1a8 + lVar1 + -0x20);
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  TApp::run(&this->super_TApp);
  testing::internal::CmpHelperEQ<char[14],std::__cxx11::string>
            ((internal *)&str,"\"I am a string\"","val1",(char (*) [14])"I am a string",&val1);
  if ((char)str._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_218);
    if (str._M_string_length != 0) {
      pcVar2 = *(char **)str._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0x29a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_218);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&str._M_string_length);
  testing::internal::CmpHelperEQ<char[26],std::__cxx11::string>
            ((internal *)&str,"\"I am a \\\"confusing\\\" string\"","val2",
             (char (*) [26])"I am a \"confusing\" string",&val2);
  if ((char)str._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_218);
    if (str._M_string_length == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)str._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0x29b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_218);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&str._M_string_length);
  pcVar2 = "";
  std::__cxx11::string::string((string *)&local_c8,"",(allocator *)&local_218);
  CLI::App::config_to_str(&str,this_00,false,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::string((string *)&local_1f8,"val1=\"I am a string\"",&local_219);
  testing::HasSubstr(&local_e8,&local_1f8);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
            (&local_218,(internal *)&local_e8,matcher);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(&gtest_ar_2,(char *)&local_218,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"str");
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_1f8);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_218);
    if (gtest_ar_2.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0x29e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_218);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  std::__cxx11::string::string
            ((string *)&local_1f8,"val2=\'I am a \"confusing\" string\'",&local_219);
  testing::HasSubstr(&local_108,&local_1f8);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
            (&local_218,(internal *)&local_108,matcher_00);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(&gtest_ar_2,(char *)&local_218,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"str");
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_1f8);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_218);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0x29f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_218);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  std::__cxx11::string::~string((string *)&str);
  std::__cxx11::string::~string((string *)&val2);
  std::__cxx11::string::~string((string *)&val1);
  return;
}

Assistant:

TEST_F(TApp, IniQuotedOutput) {

    std::string val1;
    app.add_option("--val1", val1);

    std::string val2;
    app.add_option("--val2", val2);

    args = {"--val1", "I am a string", "--val2", R"(I am a "confusing" string)"};

    run();

    EXPECT_EQ("I am a string", val1);
    EXPECT_EQ("I am a \"confusing\" string", val2);

    std::string str = app.config_to_str();
    EXPECT_THAT(str, HasSubstr("val1=\"I am a string\""));
    EXPECT_THAT(str, HasSubstr("val2='I am a \"confusing\" string'"));
}